

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant * CreateConstantInt(Allocator *allocator,SynBase *source,int value)

{
  VmType type;
  VmConstant *this;
  VmConstant *result;
  int value_local;
  SynBase *source_local;
  Allocator *allocator_local;
  
  this = anon_unknown.dwarf_1aec77::get<VmConstant>(allocator);
  type.structType = VmType::Int.structType;
  type.type = VmType::Int.type;
  type.size = VmType::Int.size;
  VmConstant::VmConstant(this,allocator,type,source);
  this->iValue = value;
  return this;
}

Assistant:

VmConstant* CreateConstantInt(Allocator *allocator, SynBase *source, int value)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Int, source);

	result->iValue = value;

	return result;
}